

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
          (cmInstallTargetGeneratorLocal *this,cmLocalGenerator *lg,string *t,string *dest,
          bool implib)

{
  byte bVar1;
  string *dest_00;
  MessageLevel message;
  cmMakefile *mf;
  cmListFileBacktrace local_e8;
  allocator<char> local_c9;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [2];
  allocator<char> local_71;
  string local_70;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool implib_local;
  string *dest_local;
  string *t_local;
  cmLocalGenerator *lg_local;
  cmInstallTargetGeneratorLocal *this_local;
  
  local_29 = implib;
  psStack_28 = dest;
  dest_local = t;
  t_local = (string *)lg;
  lg_local = (cmLocalGenerator *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)t);
  dest_00 = psStack_28;
  bVar1 = local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  local_a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Unspecified",&local_c9);
  mf = cmLocalGenerator::GetMakefile((cmLocalGenerator *)t_local);
  message = cmInstallGenerator::SelectMessageLevel(mf,false);
  local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&local_e8);
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (&this->super_cmInstallTargetGenerator,&local_50,dest_00,(bool)(bVar1 & 1),&local_70,
             local_a8,&local_c8,message,false,false,&local_e8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmInstallTargetGenerator).super_cmInstallGenerator.super_cmScriptGenerator.
  _vptr_cmScriptGenerator = (_func_int **)&PTR__cmInstallTargetGeneratorLocal_0154f780;
  (*(this->super_cmInstallTargetGenerator).super_cmInstallGenerator.super_cmScriptGenerator.
    _vptr_cmScriptGenerator[10])(this,t_local);
  return;
}

Assistant:

cmInstallTargetGeneratorLocal(cmLocalGenerator* lg, std::string const& t,
                                std::string const& dest, bool implib)
    : cmInstallTargetGenerator(
        t, dest, implib, "", std::vector<std::string>(), "Unspecified",
        cmInstallGenerator::SelectMessageLevel(lg->GetMakefile()), false,
        false)
  {
    this->Compute(lg);
  }